

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_type_handler.h
# Opt level: O0

uint8_t * google::protobuf::internal::
          MapEntryFuncs<int,_proto2_unittest::Proto2MapEnumPlusExtra,_(google::protobuf::internal::WireFormatLite::FieldType)17,_(google::protobuf::internal::WireFormatLite::FieldType)14>
          ::InternalSerialize(int field_number,int *key,Proto2MapEnumPlusExtra *value,uint8_t *ptr,
                             EpsCopyOutputStream *stream)

{
  uint32_t value_00;
  uint8_t *puVar1;
  MapEntryAccessorType local_34;
  EpsCopyOutputStream *local_30;
  EpsCopyOutputStream *stream_local;
  uint8_t *ptr_local;
  Proto2MapEnumPlusExtra *value_local;
  int *key_local;
  int field_number_local;
  
  local_30 = stream;
  stream_local = (EpsCopyOutputStream *)ptr;
  ptr_local = (uint8_t *)value;
  value_local = (Proto2MapEnumPlusExtra *)key;
  key_local._4_4_ = field_number;
  stream_local = (EpsCopyOutputStream *)protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,ptr);
  stream_local = (EpsCopyOutputStream *)
                 WireFormatLite::WriteTagToArray
                           (key_local._4_4_,WIRETYPE_LENGTH_DELIMITED,(uint8_t *)stream_local);
  value_00 = GetCachedSize((int *)value_local,(Proto2MapEnumPlusExtra *)ptr_local);
  stream_local = (EpsCopyOutputStream *)
                 protobuf::io::CodedOutputStream::WriteVarint32ToArray
                           (value_00,(uint8_t *)stream_local);
  stream_local = (EpsCopyOutputStream *)
                 MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)17,_int>::
                 Write(1,(MapEntryAccessorType *)value_local,(uint8_t *)stream_local,local_30);
  local_34 = *(MapEntryAccessorType *)ptr_local;
  puVar1 = MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)14,_proto2_unittest::Proto2MapEnumPlusExtra>
           ::Write(2,&local_34,(uint8_t *)stream_local,local_30);
  return puVar1;
}

Assistant:

static uint8_t* InternalSerialize(int field_number, const Key& key,
                                    const Value& value, uint8_t* ptr,
                                    io::EpsCopyOutputStream* stream) {
    ptr = stream->EnsureSpace(ptr);
    ptr = WireFormatLite::WriteTagToArray(
        field_number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED, ptr);
    ptr = io::CodedOutputStream::WriteVarint32ToArray(GetCachedSize(key, value),
                                                      ptr);

    ptr = KeyTypeHandler::Write(kKeyFieldNumber, key, ptr, stream);
    return ValueTypeHandler::Write(kValueFieldNumber, value, ptr, stream);
  }